

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PagePool.h
# Opt level: O2

void __thiscall Memory::PagePool::~PagePool(PagePool *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PagePoolFreePage *pPVar4;
  PagePoolFreePage *page;
  PagePoolFreePage *this_00;
  
  if (this->freePageList != (PagePoolFreePage *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PagePool.h"
                       ,0x5c,"(freePageList == nullptr)","freePageList == nullptr");
    if (!bVar2) {
LAB_0068ae81:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = this->reservedPageList;
  if (this_00 != (PagePoolFreePage *)0x0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while (this_00 != (PagePoolFreePage *)0x0) {
      pPVar4 = this_00;
      if ((this_00->super_PagePoolPage).isReserved == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PagePool.h"
                           ,99,"(page->IsReserved())","page->IsReserved()");
        if (!bVar2) goto LAB_0068ae81;
        *puVar3 = 0;
        pPVar4 = this->reservedPageList;
      }
      this->reservedPageList = pPVar4->nextFreePage;
      PagePoolPage::Free(&this_00->super_PagePoolPage);
      this_00 = this->reservedPageList;
    }
  }
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::~PageAllocatorBase(&this->pageAllocator);
  return;
}

Assistant:

~PagePool()
    {
        Assert(freePageList == nullptr);

        if (reservedPageList != nullptr)
        {
            while (reservedPageList != nullptr)
            {
                PagePoolFreePage * page = reservedPageList;
                Assert(page->IsReserved());
                reservedPageList = reservedPageList->nextFreePage;
                page->Free();
            }
        }
    }